

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.hpp
# Opt level: O1

void __thiscall
fmt::impl::counting_ostream<char,_std::char_traits<char>_>::counting_ostream
          (counting_ostream<char,_std::char_traits<char>_> *this,
          basic_ostream<char,_std::char_traits<char>_> *out)

{
  undefined1 *this_00;
  undefined8 uVar1;
  locale lStack_48;
  undefined1 *local_40;
  locale local_38;
  
  this_00 = &(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x58;
  std::ios_base::ios_base((ios_base *)this_00);
  *(undefined8 *)&this->field_0x130 = 0;
  *(undefined2 *)&this->field_0x138 = 0;
  *(undefined8 *)&this->field_0x140 = 0;
  *(undefined8 *)&this->field_0x148 = 0;
  *(undefined8 *)&this->field_0x150 = 0;
  *(undefined8 *)&this->field_0x158 = 0;
  local_40 = &(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x8;
  (this->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream =
       (_func_int **)0x1b2378;
  *(undefined8 *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x58 = 0x1b23a0;
  std::ios::init((streambuf *)this_00);
  (this->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream =
       (_func_int **)&PTR__counting_ostream_001b2328;
  *(undefined ***)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x58 =
       &PTR__counting_ostream_001b2350;
  uVar1 = *(undefined8 *)(&out->field_0xe8 + (long)out->_vptr_basic_ostream[-3]);
  *(code **)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x8 = sysconf;
  *(undefined8 *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x10 = 0;
  *(undefined8 *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x18 = 0;
  *(undefined8 *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x20 = 0;
  *(undefined8 *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x28 = 0;
  *(undefined8 *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x20 = 0;
  *(undefined8 *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x28 = 0;
  *(undefined8 *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x30 = 0;
  *(undefined8 *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x38 = 0;
  std::locale::locale((locale *)
                      &(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x40);
  *(undefined ***)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x8 =
       &PTR__streambuf_001b23d8;
  *(undefined8 *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x48 = uVar1;
  *(undefined8 *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x50 = 0;
  std::locale::locale(&lStack_48,(locale *)(&out->field_0xd0 + (long)out->_vptr_basic_ostream[-3]));
  std::ios::imbue(&local_38);
  std::locale::~locale(&local_38);
  std::locale::~locale(&lStack_48);
  return;
}

Assistant:

counting_ostream(std::basic_ostream<CharT, Traits>& out) :
	    Base(&sbuf), sbuf(*(out.rdbuf())) {
	 /* inherit locale from our base stream */
	 this->imbue(out.getloc());
      }